

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall icu_63::VTimeZone::parse(VTimeZone *this,UErrorCode *status)

{
  UBool UVar1;
  int8_t iVar2;
  char cVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t startYear;
  UVector *pUVar9;
  UnicodeString *pUVar10;
  RuleBasedTimeZone *pRVar11;
  TimeArrayTimeZoneRule *this_00;
  AnnualTimeZoneRule *pAVar12;
  DateTimeRule *dateTimeRule;
  TimeZoneRule *pTVar13;
  long *plVar14;
  UErrorCode *size;
  code *size_00;
  ConstChar16Ptr *pCVar15;
  size_t size_01;
  ulong size_02;
  int32_t *month;
  bool bVar16;
  bool bVar17;
  UDate UVar18;
  AnnualTimeZoneRule *local_668;
  TimeArrayTimeZoneRule *local_648;
  AnnualTimeZoneRule *local_5f8;
  RuleBasedTimeZone *local_5d0;
  RuleBasedTimeZone *local_5c0;
  UnicodeString *local_558;
  UnicodeString *local_538;
  UnicodeString *local_528;
  UVector *local_488;
  UVector *local_470;
  TimeZoneRule *r_2;
  TimeZoneRule *tzr;
  int32_t local_43c;
  int32_t local_438;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t d;
  int32_t m;
  int32_t y;
  undefined1 local_418 [8];
  UnicodeString tznam;
  TimeZoneRule *newRule;
  UDate lastStart;
  TimeZoneRule *r_1;
  UDate start_1;
  UDate finalStart;
  int32_t tmpDST;
  int32_t tmpRaw;
  AnnualTimeZoneRule *finalRule;
  AnnualTimeZoneRule *atzrule;
  TimeZoneRule *r;
  RuleBasedTimeZone *local_388;
  undefined1 local_379;
  RuleBasedTimeZone *local_378;
  char local_369;
  double dStack_368;
  UBool startAvail;
  UDate actualStart;
  UDate start;
  int32_t dstSavings;
  int32_t rawOffset;
  int32_t toOffset;
  int32_t fromOffset;
  TimeZoneRule *rule;
  undefined1 local_331;
  UnicodeString *local_330;
  ConstChar16Ptr local_328;
  undefined1 local_319;
  UnicodeString *local_318;
  undefined1 local_309;
  UnicodeString *local_308;
  int local_2fc;
  UnicodeString *pUStack_2f8;
  int32_t dend;
  UnicodeString *dstr;
  int32_t dstart;
  UBool nextDate;
  ConstChar16Ptr local_2e0;
  ConstChar16Ptr local_2d8;
  ConstChar16Ptr local_2d0;
  ConstChar16Ptr local_2c8;
  ConstChar16Ptr local_2c0;
  ConstChar16Ptr local_2b8;
  ConstChar16Ptr local_2b0;
  char local_2a1;
  UBool isDST;
  ConstChar16Ptr local_298;
  ConstChar16Ptr local_290;
  ConstChar16Ptr local_288;
  byte local_279;
  ConstChar16Ptr local_278;
  ConstChar16Ptr local_270;
  int local_264;
  UnicodeString *pUStack_260;
  int32_t valueSep;
  UnicodeString *line;
  UVector *local_250;
  undefined1 local_241;
  UVector *local_240;
  int local_238;
  int32_t local_234;
  int32_t finalRuleCount;
  int32_t finalRuleIdx;
  UVector *rules;
  UVector *dates;
  UnicodeString value;
  UnicodeString name;
  UDate firstStart;
  uint local_190;
  int32_t initialDSTSavings;
  int32_t initialRawOffset;
  UBool isRRULE;
  UnicodeString dtstart;
  UnicodeString zonename;
  UnicodeString to;
  undefined1 local_b8 [8];
  UnicodeString from;
  int32_t local_70;
  int iStack_6c;
  UBool dst;
  int32_t n;
  int32_t state;
  UnicodeString tzid;
  RuleBasedTimeZone *rbtz;
  InitialTimeZoneRule *initialRule;
  UErrorCode *status_local;
  VTimeZone *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  if ((this->vtzlines == (UVector *)0x0) || (iVar4 = UVector::size(this->vtzlines), iVar4 == 0)) {
    *status = U_INVALID_STATE_ERROR;
    return;
  }
  rbtz = (RuleBasedTimeZone *)0x0;
  tzid.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)&n);
  iStack_6c = 0;
  from.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_b8);
  UnicodeString::UnicodeString((UnicodeString *)((long)&zonename.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)((long)&dtstart.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)&initialRawOffset);
  bVar17 = false;
  local_190 = 0;
  firstStart._4_4_ = 0;
  name.fUnion._48_8_ = 0x43846a3eddf8cd80;
  UnicodeString::UnicodeString((UnicodeString *)((long)&value.fUnion + 0x30));
  UnicodeString::UnicodeString((UnicodeString *)&dates);
  rules = (UVector *)0x0;
  _finalRuleCount = (UVector *)0x0;
  local_234 = -1;
  local_238 = 0;
  pUVar9 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
  local_241 = 0;
  local_470 = (UVector *)0x0;
  if (pUVar9 != (UVector *)0x0) {
    local_241 = 1;
    local_240 = pUVar9;
    UVector::UVector(pUVar9,status);
    local_470 = pUVar9;
  }
  _finalRuleCount = local_470;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    size_00 = deleteTimeZoneRule;
    UVector::setDeleter(_finalRuleCount,deleteTimeZoneRule);
    pUVar9 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size_00);
    line._7_1_ = 0;
    local_488 = (UVector *)0x0;
    if (pUVar9 != (UVector *)0x0) {
      line._7_1_ = 1;
      local_250 = pUVar9;
      UVector::UVector(pUVar9,uprv_deleteUObject_63,uhash_compareUnicodeString_63,status);
      local_488 = pUVar9;
    }
    rules = local_488;
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      if ((_finalRuleCount == (UVector *)0x0) || (rules == (UVector *)0x0)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        for (local_70 = 0; iVar4 = UVector::size(this->vtzlines), local_70 < iVar4;
            local_70 = local_70 + 1) {
          pUStack_260 = (UnicodeString *)UVector::elementAt(this->vtzlines,local_70);
          local_264 = UnicodeString::indexOf(pUStack_260,L':');
          if (-1 < local_264) {
            UnicodeString::setTo
                      ((UnicodeString *)((long)&value.fUnion + 0x30),pUStack_260,0,local_264);
            UnicodeString::setTo((UnicodeString *)&dates,pUStack_260,local_264 + 1);
            if (iStack_6c == 0) {
              local_279 = 0;
              ConstChar16Ptr::ConstChar16Ptr(&local_270,(char16_t *)ICAL_BEGIN);
              iVar2 = UnicodeString::compare
                                ((UnicodeString *)((long)&value.fUnion + 0x30),&local_270,-1);
              bVar16 = false;
              if (iVar2 == '\0') {
                ConstChar16Ptr::ConstChar16Ptr(&local_278,(char16_t *)ICAL_VTIMEZONE);
                local_279 = 1;
                iVar2 = UnicodeString::compare((UnicodeString *)&dates,&local_278,-1);
                bVar16 = iVar2 == '\0';
              }
              if ((local_279 & 1) != 0) {
                ConstChar16Ptr::~ConstChar16Ptr(&local_278);
              }
              ConstChar16Ptr::~ConstChar16Ptr(&local_270);
              if (bVar16) {
                iStack_6c = 1;
              }
            }
            else if (iStack_6c == 1) {
              ConstChar16Ptr::ConstChar16Ptr(&local_288,(char16_t *)ICAL_TZID);
              iVar2 = UnicodeString::compare
                                ((UnicodeString *)((long)&value.fUnion + 0x30),&local_288,-1);
              ConstChar16Ptr::~ConstChar16Ptr(&local_288);
              if (iVar2 == '\0') {
                UnicodeString::operator=((UnicodeString *)&n,(UnicodeString *)&dates);
              }
              else {
                ConstChar16Ptr::ConstChar16Ptr(&local_290,(char16_t *)ICAL_TZURL);
                iVar2 = UnicodeString::compare
                                  ((UnicodeString *)((long)&value.fUnion + 0x30),&local_290,-1);
                ConstChar16Ptr::~ConstChar16Ptr(&local_290);
                if (iVar2 == '\0') {
                  UnicodeString::operator=(&this->tzurl,(UnicodeString *)&dates);
                }
                else {
                  ConstChar16Ptr::ConstChar16Ptr(&local_298,(char16_t *)ICAL_LASTMOD);
                  iVar2 = UnicodeString::compare
                                    ((UnicodeString *)((long)&value.fUnion + 0x30),&local_298,-1);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_298);
                  if (iVar2 == '\0') {
                    UVar18 = parseDateTimeString((UnicodeString *)&dates,0,status);
                    this->lastmod = UVar18;
                    cVar3 = ::U_FAILURE(*status);
joined_r0x0025af31:
                    if (cVar3 != '\0') goto LAB_0025c6d2;
                  }
                  else {
                    ConstChar16Ptr::ConstChar16Ptr
                              ((ConstChar16Ptr *)&stack0xfffffffffffffd60,(char16_t *)ICAL_BEGIN);
                    iVar2 = UnicodeString::compare
                                      ((UnicodeString *)((long)&value.fUnion + 0x30),
                                       (ConstChar16Ptr *)&stack0xfffffffffffffd60,-1);
                    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffd60);
                    if (iVar2 == '\0') {
                      ConstChar16Ptr::ConstChar16Ptr(&local_2b0,(char16_t *)ICAL_DAYLIGHT);
                      iVar2 = UnicodeString::compare((UnicodeString *)&dates,&local_2b0,-1);
                      ConstChar16Ptr::~ConstChar16Ptr(&local_2b0);
                      local_2a1 = iVar2 == '\0';
                      ConstChar16Ptr::ConstChar16Ptr(&local_2b8,(char16_t *)ICAL_STANDARD);
                      pCVar15 = &local_2b8;
                      iVar2 = UnicodeString::compare((UnicodeString *)&dates,pCVar15,-1);
                      bVar17 = local_2a1 == '\0';
                      ConstChar16Ptr::~ConstChar16Ptr(&local_2b8);
                      if ((iVar2 != '\0' && bVar17) ||
                         (iVar4 = UnicodeString::length((UnicodeString *)&n), iVar4 == 0))
                      goto LAB_0025c6d2;
                      iVar4 = UVector::size(rules);
                      if (iVar4 != 0) {
                        UVector::removeAllElements(rules);
                      }
                      bVar17 = false;
                      UnicodeString::remove((UnicodeString *)local_b8,(char *)pCVar15);
                      UnicodeString::remove
                                ((UnicodeString *)((long)&zonename.fUnion + 0x30),(char *)pCVar15);
                      UnicodeString::remove
                                ((UnicodeString *)((long)&dtstart.fUnion + 0x30),(char *)pCVar15);
                      from.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = local_2a1;
                      iStack_6c = 2;
                    }
                    else {
                      ConstChar16Ptr::ConstChar16Ptr(&local_2c0,L"END");
                      UnicodeString::compare
                                ((UnicodeString *)((long)&value.fUnion + 0x30),&local_2c0,-1);
                      ConstChar16Ptr::~ConstChar16Ptr(&local_2c0);
                    }
                  }
                }
              }
            }
            else if (iStack_6c == 2) {
              ConstChar16Ptr::ConstChar16Ptr(&local_2c8,(char16_t *)ICAL_DTSTART);
              iVar2 = UnicodeString::compare
                                ((UnicodeString *)((long)&value.fUnion + 0x30),&local_2c8,-1);
              ConstChar16Ptr::~ConstChar16Ptr(&local_2c8);
              if (iVar2 == '\0') {
                UnicodeString::operator=((UnicodeString *)&initialRawOffset,(UnicodeString *)&dates)
                ;
              }
              else {
                ConstChar16Ptr::ConstChar16Ptr(&local_2d0,(char16_t *)ICAL_TZNAME);
                iVar2 = UnicodeString::compare
                                  ((UnicodeString *)((long)&value.fUnion + 0x30),&local_2d0,-1);
                ConstChar16Ptr::~ConstChar16Ptr(&local_2d0);
                if (iVar2 == '\0') {
                  UnicodeString::operator=
                            ((UnicodeString *)((long)&dtstart.fUnion + 0x30),(UnicodeString *)&dates
                            );
                }
                else {
                  ConstChar16Ptr::ConstChar16Ptr(&local_2d8,(char16_t *)ICAL_TZOFFSETFROM);
                  iVar2 = UnicodeString::compare
                                    ((UnicodeString *)((long)&value.fUnion + 0x30),&local_2d8,-1);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_2d8);
                  if (iVar2 == '\0') {
                    UnicodeString::operator=((UnicodeString *)local_b8,(UnicodeString *)&dates);
                  }
                  else {
                    ConstChar16Ptr::ConstChar16Ptr(&local_2e0,(char16_t *)ICAL_TZOFFSETTO);
                    iVar2 = UnicodeString::compare
                                      ((UnicodeString *)((long)&value.fUnion + 0x30),&local_2e0,-1);
                    ConstChar16Ptr::~ConstChar16Ptr(&local_2e0);
                    if (iVar2 == '\0') {
                      UnicodeString::operator=
                                ((UnicodeString *)((long)&zonename.fUnion + 0x30),
                                 (UnicodeString *)&dates);
                    }
                    else {
                      ConstChar16Ptr::ConstChar16Ptr
                                ((ConstChar16Ptr *)&dstart,(char16_t *)ICAL_RDATE);
                      iVar2 = UnicodeString::compare
                                        ((UnicodeString *)((long)&value.fUnion + 0x30),
                                         (ConstChar16Ptr *)&dstart,-1);
                      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&dstart);
                      if (iVar2 == '\0') {
                        if (bVar17) goto LAB_0025c6d2;
                        dstr._7_1_ = '\x01';
                        dstr._0_4_ = 0;
                        while (dstr._7_1_ != '\0') {
                          size_01 = 0x2c;
                          local_2fc = UnicodeString::indexOf
                                                ((UnicodeString *)&dates,L',',(int32_t)dstr);
                          if (local_2fc == -1) {
                            pUVar10 = (UnicodeString *)
                                      UMemory::operator_new((UMemory *)0x40,size_01);
                            local_309 = 0;
                            local_528 = (UnicodeString *)0x0;
                            if (pUVar10 != (UnicodeString *)0x0) {
                              local_309 = 1;
                              local_308 = pUVar10;
                              UnicodeString::UnicodeString
                                        (pUVar10,(UnicodeString *)&dates,(int32_t)dstr);
                              local_528 = pUVar10;
                            }
                            pUStack_2f8 = local_528;
                            dstr._7_1_ = '\0';
                          }
                          else {
                            pUVar10 = (UnicodeString *)
                                      UMemory::operator_new((UMemory *)0x40,size_01);
                            local_319 = 0;
                            local_538 = (UnicodeString *)0x0;
                            if (pUVar10 != (UnicodeString *)0x0) {
                              local_319 = 1;
                              local_318 = pUVar10;
                              UnicodeString::UnicodeString
                                        (pUVar10,(UnicodeString *)&dates,(int32_t)dstr,
                                         local_2fc - (int32_t)dstr);
                              local_538 = pUVar10;
                            }
                            pUStack_2f8 = local_538;
                          }
                          UVector::addElement(rules,pUStack_2f8,status);
                          UVar1 = ::U_FAILURE(*status);
                          if (UVar1 != '\0') goto LAB_0025c6d2;
                          dstr._0_4_ = local_2fc + 1;
                        }
                      }
                      else {
                        ConstChar16Ptr::ConstChar16Ptr(&local_328,(char16_t *)ICAL_RRULE);
                        pCVar15 = &local_328;
                        iVar2 = UnicodeString::compare
                                          ((UnicodeString *)((long)&value.fUnion + 0x30),pCVar15,-1)
                        ;
                        ConstChar16Ptr::~ConstChar16Ptr(&local_328);
                        if (iVar2 == '\0') {
                          if ((bVar17) || (iVar4 = UVector::size(rules), iVar4 == 0)) {
                            pUVar9 = rules;
                            bVar17 = true;
                            pUVar10 = (UnicodeString *)
                                      UMemory::operator_new((UMemory *)0x40,(size_t)pCVar15);
                            local_331 = 0;
                            local_558 = (UnicodeString *)0x0;
                            if (pUVar10 != (UnicodeString *)0x0) {
                              local_331 = 1;
                              local_330 = pUVar10;
                              UnicodeString::UnicodeString(pUVar10,(UnicodeString *)&dates);
                              local_558 = pUVar10;
                            }
                            UVector::addElement(pUVar9,local_558,status);
                            cVar3 = ::U_FAILURE(*status);
                            goto joined_r0x0025af31;
                          }
                          goto LAB_0025c6d2;
                        }
                        ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&rule,L"END");
                        iVar2 = UnicodeString::compare
                                          ((UnicodeString *)((long)&value.fUnion + 0x30),
                                           (ConstChar16Ptr *)&rule,-1);
                        ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&rule);
                        if (iVar2 == '\0') {
                          iVar4 = UnicodeString::length((UnicodeString *)&initialRawOffset);
                          if (((iVar4 == 0) ||
                              (iVar4 = UnicodeString::length((UnicodeString *)local_b8), iVar4 == 0)
                              ) || (iVar4 = UnicodeString::length
                                                      ((UnicodeString *)
                                                       ((long)&zonename.fUnion + 0x30)), iVar4 == 0)
                             ) goto LAB_0025c6d2;
                          iVar4 = UnicodeString::length
                                            ((UnicodeString *)((long)&dtstart.fUnion + 0x30));
                          if (iVar4 == 0) {
                            getDefaultTZName((UnicodeString *)&n,
                                             from.fUnion.fStackFields.fBuffer[0x1a]._1_1_,
                                             (UnicodeString *)((long)&dtstart.fUnion + 0x30));
                          }
                          _toOffset = (TimeZoneRule *)0x0;
                          rawOffset = 0;
                          dstSavings = 0;
                          start._4_4_ = 0;
                          start._0_4_ = 0;
                          actualStart = 0.0;
                          rawOffset = offsetStrToMillis((UnicodeString *)local_b8,status);
                          dstSavings = offsetStrToMillis((UnicodeString *)
                                                         ((long)&zonename.fUnion + 0x30),status);
                          UVar1 = ::U_FAILURE(*status);
                          if (UVar1 != '\0') goto LAB_0025c6d2;
                          if (from.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') {
                            start._4_4_ = dstSavings;
                            start._0_4_ = 0;
                          }
                          else if (dstSavings - rawOffset < 1) {
                            start._4_4_ = dstSavings + -3600000;
                            start._0_4_ = 3600000;
                          }
                          else {
                            start._4_4_ = rawOffset;
                            start._0_4_ = dstSavings - rawOffset;
                          }
                          actualStart = parseDateTimeString((UnicodeString *)&initialRawOffset,
                                                            rawOffset,status);
                          UVar1 = ::U_FAILURE(*status);
                          if (UVar1 != '\0') goto LAB_0025c6d2;
                          dStack_368 = 1.838821689216e+17;
                          if (bVar17) {
                            _toOffset = createRuleByRRULE((UnicodeString *)
                                                          ((long)&dtstart.fUnion + 0x30),start._4_4_
                                                          ,start._0_4_,actualStart,rules,rawOffset,
                                                          status);
                          }
                          else {
                            _toOffset = createRuleByRDATE((UnicodeString *)
                                                          ((long)&dtstart.fUnion + 0x30),start._4_4_
                                                          ,start._0_4_,actualStart,rules,rawOffset,
                                                          status);
                          }
                          UVar1 = ::U_FAILURE(*status);
                          if ((UVar1 != '\0') || (_toOffset == (TimeZoneRule *)0x0))
                          goto LAB_0025c6d2;
                          iVar5 = (*(_toOffset->super_UObject)._vptr_UObject[7])
                                            (_toOffset,(ulong)(uint)rawOffset,0,
                                             &stack0xfffffffffffffc98);
                          local_369 = (char)iVar5;
                          if ((local_369 != '\0') && (dStack_368 < (double)name.fUnion._48_8_)) {
                            name.fUnion._48_8_ = dStack_368;
                            if (start._0_4_ < 1) {
                              if (rawOffset - dstSavings == 3600000) {
                                local_190 = rawOffset - 3600000;
                                firstStart._4_4_ = 3600000;
                              }
                              else {
                                local_190 = rawOffset;
                                firstStart._4_4_ = 0;
                              }
                            }
                            else {
                              local_190 = rawOffset;
                              firstStart._4_4_ = 0;
                            }
                          }
                          UVector::addElement(_finalRuleCount,_toOffset,status);
                          UVar1 = ::U_FAILURE(*status);
                          if (UVar1 != '\0') goto LAB_0025c6d2;
                          iStack_6c = 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar4 = UVector::size(_finalRuleCount);
        if (iVar4 != 0) {
          pUVar10 = (UnicodeString *)0x0;
          getDefaultTZName((UnicodeString *)&n,'\0',(UnicodeString *)((long)&dtstart.fUnion + 0x30))
          ;
          pRVar11 = (RuleBasedTimeZone *)UMemory::operator_new((UMemory *)0x50,(size_t)pUVar10);
          local_379 = 0;
          local_5c0 = (RuleBasedTimeZone *)0x0;
          if (pRVar11 != (RuleBasedTimeZone *)0x0) {
            local_379 = 1;
            pUVar10 = (UnicodeString *)(&dtstart.fUnion.fFields + 2);
            local_378 = pRVar11;
            InitialTimeZoneRule::InitialTimeZoneRule
                      ((InitialTimeZoneRule *)pRVar11,pUVar10,local_190,firstStart._4_4_);
            local_5c0 = pRVar11;
          }
          rbtz = local_5c0;
          if (local_5c0 == (RuleBasedTimeZone *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            pRVar11 = (RuleBasedTimeZone *)UMemory::operator_new((UMemory *)0x70,(size_t)pUVar10);
            r._7_1_ = 0;
            local_5d0 = (RuleBasedTimeZone *)0x0;
            if (pRVar11 != (RuleBasedTimeZone *)0x0) {
              r._7_1_ = 1;
              local_388 = pRVar11;
              RuleBasedTimeZone::RuleBasedTimeZone
                        (pRVar11,(UnicodeString *)&n,(InitialTimeZoneRule *)local_5c0);
              local_5d0 = pRVar11;
            }
            tzid.fUnion._48_8_ = local_5d0;
            if (local_5d0 == (RuleBasedTimeZone *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              rbtz = (RuleBasedTimeZone *)0x0;
              for (local_70 = 0; iVar4 = UVector::size(_finalRuleCount), local_70 < iVar4;
                  local_70 = local_70 + 1) {
                atzrule = (AnnualTimeZoneRule *)UVector::elementAt(_finalRuleCount,local_70);
                if (atzrule == (AnnualTimeZoneRule *)0x0) {
                  local_5f8 = (AnnualTimeZoneRule *)0x0;
                }
                else {
                  local_5f8 = (AnnualTimeZoneRule *)
                              __dynamic_cast(atzrule,&TimeZoneRule::typeinfo,
                                             &AnnualTimeZoneRule::typeinfo,0);
                }
                finalRule = local_5f8;
                if ((local_5f8 != (AnnualTimeZoneRule *)0x0) &&
                   (iVar4 = AnnualTimeZoneRule::getEndYear(local_5f8), iVar4 == 0x7fffffff)) {
                  local_238 = local_238 + 1;
                  local_234 = local_70;
                }
              }
              if (local_238 < 3) {
                if (local_238 == 1) {
                  iVar4 = UVector::size(_finalRuleCount);
                  if (iVar4 == 1) {
                    UVector::removeAllElements(_finalRuleCount);
                  }
                  else {
                    _tmpDST = (AnnualTimeZoneRule *)UVector::elementAt(_finalRuleCount,local_234);
                    finalStart._4_4_ = TimeZoneRule::getRawOffset((TimeZoneRule *)_tmpDST);
                    finalStart._0_4_ = TimeZoneRule::getDSTSavings(&_tmpDST->super_TimeZoneRule);
                    size_02 = (ulong)local_190;
                    (*(_tmpDST->super_TimeZoneRule).super_UObject._vptr_UObject[7])
                              (_tmpDST,size_02,(ulong)firstStart._4_4_,&start_1);
                    r_1 = (TimeZoneRule *)start_1;
                    for (local_70 = 0; iVar4 = UVector::size(_finalRuleCount), local_70 < iVar4;
                        local_70 = local_70 + 1) {
                      if (local_234 != local_70) {
                        lastStart = (UDate)UVector::elementAt(_finalRuleCount,local_70);
                        size_02 = (ulong)finalStart._4_4_;
                        (**(code **)(*(long *)lastStart + 0x40))
                                  (lastStart,size_02,finalStart._0_4_,&newRule);
                        pAVar12 = _tmpDST;
                        pTVar13 = newRule;
                        if ((double)r_1 < (double)newRule) {
                          uVar6 = TimeZoneRule::getRawOffset((TimeZoneRule *)lastStart);
                          uVar7 = TimeZoneRule::getDSTSavings((TimeZoneRule *)lastStart);
                          size_02 = (ulong)uVar6;
                          (*(pAVar12->super_TimeZoneRule).super_UObject._vptr_UObject[9])
                                    (pTVar13,pAVar12,size_02,(ulong)uVar7,0,&r_1);
                        }
                      }
                    }
                    UnicodeString::UnicodeString((UnicodeString *)local_418);
                    if (((double)r_1 != start_1) || (NAN((double)r_1) || NAN(start_1))) {
                      month = &dow;
                      Grego::timeToFields((UDate)r_1,&d,month,&doy,&mid,&local_438,&local_43c);
                      pAVar12 = (AnnualTimeZoneRule *)
                                UMemory::operator_new((UMemory *)0x60,(size_t)month);
                      local_668 = (AnnualTimeZoneRule *)0x0;
                      if (pAVar12 != (AnnualTimeZoneRule *)0x0) {
                        pUVar10 = TimeZoneRule::getName
                                            (&_tmpDST->super_TimeZoneRule,(UnicodeString *)local_418
                                            );
                        iVar4 = TimeZoneRule::getRawOffset(&_tmpDST->super_TimeZoneRule);
                        iVar8 = TimeZoneRule::getDSTSavings(&_tmpDST->super_TimeZoneRule);
                        dateTimeRule = AnnualTimeZoneRule::getRule(_tmpDST);
                        startYear = AnnualTimeZoneRule::getStartYear(_tmpDST);
                        AnnualTimeZoneRule::AnnualTimeZoneRule
                                  (pAVar12,pUVar10,iVar4,iVar8,dateTimeRule,startYear,d);
                        local_668 = pAVar12;
                      }
                      tznam.fUnion._48_8_ = local_668;
                    }
                    else {
                      this_00 = (TimeArrayTimeZoneRule *)
                                UMemory::operator_new((UMemory *)0x160,size_02);
                      m._3_1_ = 0;
                      local_648 = (TimeArrayTimeZoneRule *)0x0;
                      if (this_00 != (TimeArrayTimeZoneRule *)0x0) {
                        m._3_1_ = 1;
                        _y = this_00;
                        pUVar10 = TimeZoneRule::getName
                                            (&_tmpDST->super_TimeZoneRule,(UnicodeString *)local_418
                                            );
                        iVar4 = TimeZoneRule::getRawOffset(&_tmpDST->super_TimeZoneRule);
                        iVar8 = TimeZoneRule::getDSTSavings(&_tmpDST->super_TimeZoneRule);
                        TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
                                  (this_00,pUVar10,iVar4,iVar8,&start_1,1,UTC_TIME);
                        local_648 = this_00;
                      }
                      tznam.fUnion._48_8_ = local_648;
                    }
                    if (tznam.fUnion._48_8_ == 0) {
                      *status = U_MEMORY_ALLOCATION_ERROR;
                      bVar17 = true;
                    }
                    else {
                      UVector::removeElementAt(_finalRuleCount,local_234);
                      UVector::addElement(_finalRuleCount,(void *)tznam.fUnion._48_8_,status);
                      UVar1 = ::U_FAILURE(*status);
                      if (UVar1 == '\0') {
                        bVar17 = false;
                      }
                      else {
                        if (tznam.fUnion._48_8_ != 0) {
                          (**(code **)(*(long *)tznam.fUnion._48_8_ + 8))();
                        }
                        bVar17 = true;
                      }
                    }
                    UnicodeString::~UnicodeString((UnicodeString *)local_418);
                    if (bVar17) {
                      if (!bVar17) goto LAB_0025c7f9;
                      goto LAB_0025c6d2;
                    }
                  }
                }
                do {
                  UVar1 = UVector::isEmpty(_finalRuleCount);
                  if (UVar1 != '\0') {
                    RuleBasedTimeZone::complete((RuleBasedTimeZone *)tzid.fUnion._48_8_,status);
                    UVar1 = ::U_FAILURE(*status);
                    if (UVar1 == '\0') {
                      if (_finalRuleCount != (UVector *)0x0) {
                        (*(_finalRuleCount->super_UObject)._vptr_UObject[1])();
                      }
                      if (rules != (UVector *)0x0) {
                        (*(rules->super_UObject)._vptr_UObject[1])();
                      }
                      this->tz = (BasicTimeZone *)tzid.fUnion._48_8_;
                      TimeZone::setID((TimeZone *)this,(UnicodeString *)&n);
                      goto LAB_0025c7f9;
                    }
                    break;
                  }
                  pTVar13 = (TimeZoneRule *)UVector::orphanElementAt(_finalRuleCount,0);
                  RuleBasedTimeZone::addTransitionRule
                            ((RuleBasedTimeZone *)tzid.fUnion._48_8_,pTVar13,status);
                  UVar1 = ::U_FAILURE(*status);
                } while (UVar1 == '\0');
              }
              else {
                *status = U_ILLEGAL_ARGUMENT_ERROR;
              }
            }
          }
        }
      }
    }
  }
LAB_0025c6d2:
  if (_finalRuleCount != (UVector *)0x0) {
    while (UVar1 = UVector::isEmpty(_finalRuleCount), UVar1 == '\0') {
      plVar14 = (long *)UVector::orphanElementAt(_finalRuleCount,0);
      if (plVar14 != (long *)0x0) {
        (**(code **)(*plVar14 + 8))();
      }
    }
    if (_finalRuleCount != (UVector *)0x0) {
      (*(_finalRuleCount->super_UObject)._vptr_UObject[1])();
    }
  }
  if ((rules != (UVector *)0x0) && (rules != (UVector *)0x0)) {
    (*(rules->super_UObject)._vptr_UObject[1])();
  }
  if ((rbtz != (RuleBasedTimeZone *)0x0) && (rbtz != (RuleBasedTimeZone *)0x0)) {
    (*(rbtz->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
  }
  if ((tzid.fUnion._48_8_ != 0) && (tzid.fUnion._48_8_ != 0)) {
    (**(code **)(*(long *)tzid.fUnion._48_8_ + 8))();
  }
LAB_0025c7f9:
  UnicodeString::~UnicodeString((UnicodeString *)&dates);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&value.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)&initialRawOffset);
  UnicodeString::~UnicodeString((UnicodeString *)((long)&dtstart.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)((long)&zonename.fUnion + 0x30));
  UnicodeString::~UnicodeString((UnicodeString *)local_b8);
  UnicodeString::~UnicodeString((UnicodeString *)&n);
  return;
}

Assistant:

void
VTimeZone::parse(UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    if (vtzlines == NULL || vtzlines->size() == 0) {
        status = U_INVALID_STATE_ERROR;
        return;
    }
    InitialTimeZoneRule *initialRule = NULL;
    RuleBasedTimeZone *rbtz = NULL;

    // timezone ID
    UnicodeString tzid;

    int32_t state = INI;
    int32_t n = 0;
    UBool dst = FALSE;      // current zone type
    UnicodeString from;     // current zone from offset
    UnicodeString to;       // current zone offset
    UnicodeString zonename;   // current zone name
    UnicodeString dtstart;  // current zone starts
    UBool isRRULE = FALSE;  // true if the rule is described by RRULE
    int32_t initialRawOffset = 0;   // initial offset
    int32_t initialDSTSavings = 0;  // initial offset
    UDate firstStart = MAX_MILLIS;  // the earliest rule start time
    UnicodeString name;     // RFC2445 prop name
    UnicodeString value;    // RFC2445 prop value

    UVector *dates = NULL;  // list of RDATE or RRULE strings
    UVector *rules = NULL;  // list of TimeZoneRule instances

    int32_t finalRuleIdx = -1;
    int32_t finalRuleCount = 0;

    rules = new UVector(status);
    if (U_FAILURE(status)) {
        goto cleanupParse;
    }
     // Set the deleter to remove TimeZoneRule vectors to avoid memory leaks due to unowned TimeZoneRules.
    rules->setDeleter(deleteTimeZoneRule);
    
    dates = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, status);
    if (U_FAILURE(status)) {
        goto cleanupParse;
    }
    if (rules == NULL || dates == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto cleanupParse;
    }

    for (n = 0; n < vtzlines->size(); n++) {
        UnicodeString *line = (UnicodeString*)vtzlines->elementAt(n);
        int32_t valueSep = line->indexOf(COLON);
        if (valueSep < 0) {
            continue;
        }
        name.setTo(*line, 0, valueSep);
        value.setTo(*line, valueSep + 1);

        switch (state) {
        case INI:
            if (name.compare(ICAL_BEGIN, -1) == 0
                && value.compare(ICAL_VTIMEZONE, -1) == 0) {
                state = VTZ;
            }
            break;

        case VTZ:
            if (name.compare(ICAL_TZID, -1) == 0) {
                tzid = value;
            } else if (name.compare(ICAL_TZURL, -1) == 0) {
                tzurl = value;
            } else if (name.compare(ICAL_LASTMOD, -1) == 0) {
                // Always in 'Z' format, so the offset argument for the parse method
                // can be any value.
                lastmod = parseDateTimeString(value, 0, status);
                if (U_FAILURE(status)) {
                    goto cleanupParse;
                }
            } else if (name.compare(ICAL_BEGIN, -1) == 0) {
                UBool isDST = (value.compare(ICAL_DAYLIGHT, -1) == 0);
                if (value.compare(ICAL_STANDARD, -1) == 0 || isDST) {
                    // tzid must be ready at this point
                    if (tzid.length() == 0) {
                        goto cleanupParse;
                    }
                    // initialize current zone properties
                    if (dates->size() != 0) {
                        dates->removeAllElements();
                    }
                    isRRULE = FALSE;
                    from.remove();
                    to.remove();
                    zonename.remove();
                    dst = isDST;
                    state = TZI;
                } else {
                    // BEGIN property other than STANDARD/DAYLIGHT
                    // must not be there.
                    goto cleanupParse;
                }
            } else if (name.compare(ICAL_END, -1) == 0) {
                break;
            }
            break;
        case TZI:
            if (name.compare(ICAL_DTSTART, -1) == 0) {
                dtstart = value;
            } else if (name.compare(ICAL_TZNAME, -1) == 0) {
                zonename = value;
            } else if (name.compare(ICAL_TZOFFSETFROM, -1) == 0) {
                from = value;
            } else if (name.compare(ICAL_TZOFFSETTO, -1) == 0) {
                to = value;
            } else if (name.compare(ICAL_RDATE, -1) == 0) {
                // RDATE mixed with RRULE is not supported
                if (isRRULE) {
                    goto cleanupParse;
                }
                // RDATE value may contain multiple date delimited
                // by comma
                UBool nextDate = TRUE;
                int32_t dstart = 0;
                UnicodeString *dstr;
                while (nextDate) {
                    int32_t dend = value.indexOf(COMMA, dstart);
                    if (dend == -1) {
                        dstr = new UnicodeString(value, dstart);
                        nextDate = FALSE;
                    } else {
                        dstr = new UnicodeString(value, dstart, dend - dstart);
                    }
                    dates->addElement(dstr, status);
                    if (U_FAILURE(status)) {
                        goto cleanupParse;
                    }
                    dstart = dend + 1;
                }
            } else if (name.compare(ICAL_RRULE, -1) == 0) {
                // RRULE mixed with RDATE is not supported
                if (!isRRULE && dates->size() != 0) {
                    goto cleanupParse;
                }
                isRRULE = true;
                dates->addElement(new UnicodeString(value), status);
                if (U_FAILURE(status)) {
                    goto cleanupParse;
                }
            } else if (name.compare(ICAL_END, -1) == 0) {
                // Mandatory properties
                if (dtstart.length() == 0 || from.length() == 0 || to.length() == 0) {
                    goto cleanupParse;
                }
                // if zonename is not available, create one from tzid
                if (zonename.length() == 0) {
                    getDefaultTZName(tzid, dst, zonename);
                }

                // create a time zone rule
                TimeZoneRule *rule = NULL;
                int32_t fromOffset = 0;
                int32_t toOffset = 0;
                int32_t rawOffset = 0;
                int32_t dstSavings = 0;
                UDate start = 0;

                // Parse TZOFFSETFROM/TZOFFSETTO
                fromOffset = offsetStrToMillis(from, status);
                toOffset = offsetStrToMillis(to, status);
                if (U_FAILURE(status)) {
                    goto cleanupParse;
                }

                if (dst) {
                    // If daylight, use the previous offset as rawoffset if positive
                    if (toOffset - fromOffset > 0) {
                        rawOffset = fromOffset;
                        dstSavings = toOffset - fromOffset;
                    } else {
                        // This is rare case..  just use 1 hour DST savings
                        rawOffset = toOffset - DEF_DSTSAVINGS;
                        dstSavings = DEF_DSTSAVINGS;                                
                    }
                } else {
                    rawOffset = toOffset;
                    dstSavings = 0;
                }

                // start time
                start = parseDateTimeString(dtstart, fromOffset, status);
                if (U_FAILURE(status)) {
                    goto cleanupParse;
                }

                // Create the rule
                UDate actualStart = MAX_MILLIS;
                if (isRRULE) {
                    rule = createRuleByRRULE(zonename, rawOffset, dstSavings, start, dates, fromOffset, status);
                } else {
                    rule = createRuleByRDATE(zonename, rawOffset, dstSavings, start, dates, fromOffset, status);
                }
                if (U_FAILURE(status) || rule == NULL) {
                    goto cleanupParse;
                } else {
                    UBool startAvail = rule->getFirstStart(fromOffset, 0, actualStart);
                    if (startAvail && actualStart < firstStart) {
                        // save from offset information for the earliest rule
                        firstStart = actualStart;
                        // If this is STD, assume the time before this transtion
                        // is DST when the difference is 1 hour.  This might not be
                        // accurate, but VTIMEZONE data does not have such info.
                        if (dstSavings > 0) {
                            initialRawOffset = fromOffset;
                            initialDSTSavings = 0;
                        } else {
                            if (fromOffset - toOffset == DEF_DSTSAVINGS) {
                                initialRawOffset = fromOffset - DEF_DSTSAVINGS;
                                initialDSTSavings = DEF_DSTSAVINGS;
                            } else {
                                initialRawOffset = fromOffset;
                                initialDSTSavings = 0;
                            }
                        }
                    }
                }
                rules->addElement(rule, status);
                if (U_FAILURE(status)) {
                    goto cleanupParse;
                }
                state = VTZ;
            }
            break;
        }
    }
    // Must have at least one rule
    if (rules->size() == 0) {
        goto cleanupParse;
    }

    // Create a initial rule
    getDefaultTZName(tzid, FALSE, zonename);
    initialRule = new InitialTimeZoneRule(zonename,
        initialRawOffset, initialDSTSavings);
    if (initialRule == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto cleanupParse;
    }

    // Finally, create the RuleBasedTimeZone
    rbtz = new RuleBasedTimeZone(tzid, initialRule);
    if (rbtz == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto cleanupParse;
    }
    initialRule = NULL; // already adopted by RBTZ, no need to delete

    for (n = 0; n < rules->size(); n++) {
        TimeZoneRule *r = (TimeZoneRule*)rules->elementAt(n);
        AnnualTimeZoneRule *atzrule = dynamic_cast<AnnualTimeZoneRule *>(r);
        if (atzrule != NULL) {
            if (atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR) {
                finalRuleCount++;
                finalRuleIdx = n;
            }
        }
    }
    if (finalRuleCount > 2) {
        // Too many final rules
        status = U_ILLEGAL_ARGUMENT_ERROR;
        goto cleanupParse;
    }

    if (finalRuleCount == 1) {
        if (rules->size() == 1) {
            // Only one final rule, only governs the initial rule,
            // which is already initialized, thus, we do not need to
            // add this transition rule
            rules->removeAllElements();
        } else {
            // Normalize the final rule
            AnnualTimeZoneRule *finalRule = (AnnualTimeZoneRule*)rules->elementAt(finalRuleIdx);
            int32_t tmpRaw = finalRule->getRawOffset();
            int32_t tmpDST = finalRule->getDSTSavings();

            // Find the last non-final rule
            UDate finalStart, start;
            finalRule->getFirstStart(initialRawOffset, initialDSTSavings, finalStart);
            start = finalStart;
            for (n = 0; n < rules->size(); n++) {
                if (finalRuleIdx == n) {
                    continue;
                }
                TimeZoneRule *r = (TimeZoneRule*)rules->elementAt(n);
                UDate lastStart;
                r->getFinalStart(tmpRaw, tmpDST, lastStart);
                if (lastStart > start) {
                    finalRule->getNextStart(lastStart,
                        r->getRawOffset(),
                        r->getDSTSavings(),
                        FALSE,
                        start);
                }
            }

            TimeZoneRule *newRule;
            UnicodeString tznam;
            if (start == finalStart) {
                // Transform this into a single transition
                newRule = new TimeArrayTimeZoneRule(
                        finalRule->getName(tznam),
                        finalRule->getRawOffset(),
                        finalRule->getDSTSavings(),
                        &finalStart,
                        1,
                        DateTimeRule::UTC_TIME);
            } else {
                // Update the end year
                int32_t y, m, d, dow, doy, mid;
                Grego::timeToFields(start, y, m, d, dow, doy, mid);
                newRule = new AnnualTimeZoneRule(
                        finalRule->getName(tznam),
                        finalRule->getRawOffset(),
                        finalRule->getDSTSavings(),
                        *(finalRule->getRule()),
                        finalRule->getStartYear(),
                        y);
            }
            if (newRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                goto cleanupParse;
            }
            rules->removeElementAt(finalRuleIdx);
            rules->addElement(newRule, status);
            if (U_FAILURE(status)) {
                delete newRule;
                goto cleanupParse;
            }
        }
    }

    while (!rules->isEmpty()) {
        TimeZoneRule *tzr = (TimeZoneRule*)rules->orphanElementAt(0);
        rbtz->addTransitionRule(tzr, status);
        if (U_FAILURE(status)) {
            goto cleanupParse;
        }
    }
    rbtz->complete(status);
    if (U_FAILURE(status)) {
        goto cleanupParse;
    }
    delete rules;
    delete dates;

    tz = rbtz;
    setID(tzid);
    return;

cleanupParse:
    if (rules != NULL) {
        while (!rules->isEmpty()) {
            TimeZoneRule *r = (TimeZoneRule*)rules->orphanElementAt(0);
            delete r;
        }
        delete rules;
    }
    if (dates != NULL) {
        delete dates;
    }
    if (initialRule != NULL) {
        delete initialRule;
    }
    if (rbtz != NULL) {
        delete rbtz;
    }
    return;
}